

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

ES5ArrayTypeHandler * __thiscall
Js::SimpleTypeHandler<6UL>::ConvertToES5ArrayType
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance)

{
  int *piVar1;
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar2;
  
  pEVar2 = SimpleTypeHandler<6ul>::ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>
                     ((SimpleTypeHandler<6ul> *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertSimpleToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  return pEVar2;
}

Assistant:

ES5ArrayTypeHandler* SimpleTypeHandler<size>::ConvertToES5ArrayType(DynamicObject* instance)
    {
        ES5ArrayTypeHandler* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleToDictionaryCount++;
#endif
        return newTypeHandler;
    }